

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::
format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>,_wchar_t,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>
::on_replacement_field
          (format_handler<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>,_wchar_t,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>
           *this,wchar_t *p)

{
  size_t *psVar1;
  wchar_t *pwVar2;
  type local_68;
  wchar_t *local_48;
  size_t sStack_40;
  size_t local_38;
  undefined8 uStack_30;
  basic_format_arg<fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>
  *local_28;
  undefined8 local_20;
  basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>
  *local_18;
  
  pwVar2 = (this->context).
           super_context_base<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>,_wchar_t>
           .parse_context_.format_str_.data_;
  (this->context).
  super_context_base<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>,_wchar_t>
  .parse_context_.format_str_.data_ = p;
  psVar1 = &(this->context).
            super_context_base<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>,_wchar_t>
            .parse_context_.format_str_.size_;
  *psVar1 = *psVar1 - ((long)p - (long)pwVar2 >> 2);
  local_18 = &this->context;
  if ((this->arg).type_ == custom_type) {
    (*(this->arg).value_.field_0.custom.format)((this->arg).value_.field_0.pointer,local_18);
    return;
  }
  local_28 = (basic_format_arg<fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>
              *)(this->context).
                super_context_base<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>,_wchar_t>
                .loc_.locale_;
  local_48 = (this->context).
             super_context_base<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>,_wchar_t>
             .out_.super_truncating_iterator_base<wchar_t_*>.out_;
  sStack_40 = (this->context).
              super_context_base<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>,_wchar_t>
              .out_.super_truncating_iterator_base<wchar_t_*>.limit_;
  local_38 = (this->context).
             super_context_base<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>,_wchar_t>
             .out_.super_truncating_iterator_base<wchar_t_*>.count_;
  uStack_30 = *(undefined8 *)
               &(this->context).
                super_context_base<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>,_wchar_t>
                .out_.blackhole_;
  local_20 = 0;
  visit_format_arg<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>,fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t*,std::integral_constant<bool,false>>,wchar_t>>
            (&local_68,(v5 *)&local_48,
             (arg_formatter<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>_>
              *)&this->arg,local_28);
  *(ulong *)((long)&(this->context).
                    super_context_base<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>,_wchar_t>
                    .out_.super_truncating_iterator_base<wchar_t_*>.limit_ + 4) =
       CONCAT44((undefined4)local_68.super_truncating_iterator_base<wchar_t_*>.count_,
                local_68.super_truncating_iterator_base<wchar_t_*>.limit_._4_4_);
  *(undefined8 *)
   ((long)&(this->context).
           super_context_base<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>,_wchar_t>
           .out_.super_truncating_iterator_base<wchar_t_*>.count_ + 4) = local_68._20_8_;
  (this->context).
  super_context_base<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>,_wchar_t>
  .out_.super_truncating_iterator_base<wchar_t_*>.out_ =
       local_68.super_truncating_iterator_base<wchar_t_*>.out_;
  (this->context).
  super_context_base<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_fmt::v5::basic_format_context<fmt::v5::internal::truncating_iterator<wchar_t_*,_std::integral_constant<bool,_false>_>,_wchar_t>,_wchar_t>
  .out_.super_truncating_iterator_base<wchar_t_*>.limit_ =
       CONCAT44(local_68.super_truncating_iterator_base<wchar_t_*>.limit_._4_4_,
                (undefined4)local_68.super_truncating_iterator_base<wchar_t_*>.limit_);
  return;
}

Assistant:

void on_replacement_field(const Char *p) {
    context.parse_context().advance_to(p);
    internal::custom_formatter<Char, Context> f(context);
    if (!visit_format_arg(f, arg))
      context.advance_to(visit_format_arg(ArgFormatter(context), arg));
  }